

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O2

Foo * miyuki::serialize::fromJson<Foo>(Foo *__return_storage_ptr__,Context *context,json *j)

{
  InputArchive ar;
  anon_class_16_2_514e9a72 local_b0;
  InputArchive local_a0;
  
  InputArchive::InputArchive(&local_a0,context,j);
  (__return_storage_ptr__->vec).
  super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vec).
  super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->bar2).super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->bar2).super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->vec).
  super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->bar).super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->bar).super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_b0.ar = &local_a0;
  local_b0.data = __return_storage_ptr__;
  ArchiveBase::
  tryInvoke<miyuki::serialize::fromJson<Foo>(miyuki::serialize::Context&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)::_lambda()_1_>
            (&local_a0.super_ArchiveBase,&local_b0);
  InputArchive::~InputArchive(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

T fromJson(Context &context, const json::json &j) {
        InputArchive ar(context, j);
        T data;
        ar.tryInvoke([&]() {
            ar._load(data);
        });
        return data;
    }